

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O2

int __thiscall draco::DecoderBuffer::BitDecoder::GetBit(BitDecoder *this)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = this->bit_offset_;
  uVar2 = 0;
  if (this->bit_buffer_ + (uVar1 >> 3) < this->bit_buffer_end_) {
    uVar2 = (uint)((this->bit_buffer_[uVar1 >> 3] >> ((uint)uVar1 & 7) & 1) != 0);
    this->bit_offset_ = uVar1 + 1;
  }
  return uVar2;
}

Assistant:

inline int GetBit() {
      const size_t off = bit_offset_;
      const size_t byte_offset = off >> 3;
      const int bit_shift = static_cast<int>(off & 0x7);
      if (bit_buffer_ + byte_offset < bit_buffer_end_) {
        const int bit = (bit_buffer_[byte_offset] >> bit_shift) & 1;
        bit_offset_ = off + 1;
        return bit;
      }
      return 0;
    }